

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLParser.cpp
# Opt level: O0

unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>
* iDynTree::XMLParser::XMLParserPimpl::attributesFromArray_abi_cxx11_
            (xmlChar **attributes,int nb_attributes,int nb_defaulted)

{
  ulong uVar1;
  int in_EDX;
  long in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>,_false,_true>,_bool>
  pVar2;
  string value;
  size_t len;
  xmlChar *value_end;
  xmlChar *value_start;
  string uri;
  string prefix;
  string name;
  int attributeIndex;
  int fields;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>
  *mappedAttributes;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>,_true>
  in_stack_fffffffffffffed8;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>
  *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_1;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>,_true>
  in_stack_ffffffffffffff08;
  undefined1 local_d1 [33];
  ulong local_b0;
  long local_a8;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>
  *local_a0;
  string local_98 [32];
  string local_78 [48];
  string local_48 [36];
  int local_24;
  undefined1 local_1d;
  undefined4 local_1c;
  int local_14;
  long local_10;
  
  local_1c = 5;
  local_1d = 0;
  __args_1 = in_RDI;
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>
                   *)0x12751a);
  for (local_24 = 0; local_24 < local_14; local_24 = local_24 + 1) {
    stringFromXMLCharPtr_abi_cxx11_((xmlChar *)in_stack_ffffffffffffff08._M_cur);
    stringFromXMLCharPtr_abi_cxx11_((xmlChar *)in_stack_ffffffffffffff08._M_cur);
    stringFromXMLCharPtr_abi_cxx11_((xmlChar *)in_stack_ffffffffffffff08._M_cur);
    this = *(unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>
             **)(local_10 + 0x18 + (long)(local_24 * 5) * 8);
    local_a8 = *(long *)(local_10 + 0x20 + (long)(local_24 * 5) * 8);
    uVar1 = local_a8 - (long)this;
    __args_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d1;
    local_b0 = uVar1;
    local_a0 = this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_d1 + 1),(char *)this,uVar1,(allocator *)__args_3);
    std::allocator<char>::~allocator((allocator<char> *)local_d1);
    std::
    make_shared<iDynTree::XMLAttribute,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff08._M_cur,__args_1,in_RDI,__args_3);
    pVar2 = std::
            unordered_map<std::__cxx11::string,std::shared_ptr<iDynTree::XMLAttribute>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<iDynTree::XMLAttribute>>>>
            ::emplace<std::__cxx11::string&,std::shared_ptr<iDynTree::XMLAttribute>>
                      (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffed8._M_cur,
                       (shared_ptr<iDynTree::XMLAttribute> *)
                       CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
    in_stack_fffffffffffffed8._M_cur =
         (__node_type *)
         pVar2.first.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>,_true>
         ._M_cur;
    in_stack_fffffffffffffed7 = pVar2.second;
    in_stack_ffffffffffffff08._M_cur = in_stack_fffffffffffffed8._M_cur;
    std::shared_ptr<iDynTree::XMLAttribute>::~shared_ptr
              ((shared_ptr<iDynTree::XMLAttribute> *)0x1276d1);
    std::__cxx11::string::~string((string *)(local_d1 + 1));
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::~string(local_78);
    std::__cxx11::string::~string(local_48);
  }
  return (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>
          *)__args_1;
}

Assistant:

const std::unordered_map<std::string, std::shared_ptr<XMLAttribute>> XMLParser::XMLParserPimpl::attributesFromArray(const xmlChar ** attributes,
                                                                                                       int nb_attributes,
                                                                                                       int nb_defaulted)
    {
        // TODO: how to handle the nb_defaulted parameter
        const int fields = 5;
        std::unordered_map<std::string, std::shared_ptr<XMLAttribute>> mappedAttributes;
        // Array of array. The inner array contains: localname/prefix/URI/value/end
        for (int attributeIndex = 0; attributeIndex < nb_attributes; ++attributeIndex) {
            std::string name = XMLParser::XMLParserPimpl::stringFromXMLCharPtr(attributes[attributeIndex * fields + 0]);
            std::string prefix = XMLParser::XMLParserPimpl::stringFromXMLCharPtr(attributes[attributeIndex * fields + 1]);
            std::string uri = XMLParser::XMLParserPimpl::stringFromXMLCharPtr(attributes[attributeIndex * fields + 2]);
            const xmlChar *value_start = attributes[attributeIndex * fields + 3];
            const xmlChar *value_end = attributes[attributeIndex * fields + 4];
            size_t len = value_end - value_start;
            std::string value(reinterpret_cast<const char*>(value_start), len);
            
            mappedAttributes.emplace(name, std::make_shared<XMLAttribute>(name, value, prefix, uri));
        }
        return mappedAttributes;
    }